

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O0

int hash_c_batch(PMBTOKEN_METHOD *method,EC_SCALAR *out,CBB *points,size_t index)

{
  int iVar1;
  uint8_t *data;
  size_t len_00;
  size_t local_78;
  size_t len;
  uint8_t *buf;
  CBB cbb;
  int ok;
  size_t index_local;
  CBB *points_local;
  EC_SCALAR *out_local;
  PMBTOKEN_METHOD *method_local;
  
  if (index < 0x10000) {
    cbb.u._28_4_ = 0;
    CBB_zero((CBB *)&buf);
    len = 0;
    iVar1 = CBB_init((CBB *)&buf,0);
    if ((iVar1 != 0) && (iVar1 = CBB_add_bytes((CBB *)&buf,"DLEQ BATCH",0xb), iVar1 != 0)) {
      data = CBB_data(points);
      len_00 = CBB_len(points);
      iVar1 = CBB_add_bytes((CBB *)&buf,data,len_00);
      if ((iVar1 != 0) &&
         (((iVar1 = CBB_add_u16((CBB *)&buf,(uint16_t)index), iVar1 != 0 &&
           (iVar1 = CBB_finish((CBB *)&buf,(uint8_t **)&len,&local_78), iVar1 != 0)) &&
          (iVar1 = (*method->hash_c)(method->group,out,(uint8_t *)len,local_78), iVar1 != 0)))) {
        cbb.u._28_4_ = 1;
      }
    }
    CBB_cleanup((CBB *)&buf);
    OPENSSL_free((void *)len);
    method_local._4_4_ = cbb.u._28_4_;
  }
  else {
    ERR_put_error(0x20,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                  ,0x1e2);
    method_local._4_4_ = 0;
  }
  return method_local._4_4_;
}

Assistant:

static int hash_c_batch(const PMBTOKEN_METHOD *method, EC_SCALAR *out,
                        const CBB *points, size_t index) {
  static const uint8_t kDLEQBatchLabel[] = "DLEQ BATCH";
  if (index > 0xffff) {
    // The protocol supports only two-byte batches.
    OPENSSL_PUT_ERROR(TRUST_TOKEN, ERR_R_OVERFLOW);
    return 0;
  }

  int ok = 0;
  CBB cbb;
  CBB_zero(&cbb);
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) ||
      !CBB_add_bytes(&cbb, kDLEQBatchLabel, sizeof(kDLEQBatchLabel)) ||
      !CBB_add_bytes(&cbb, CBB_data(points), CBB_len(points)) ||
      !CBB_add_u16(&cbb, (uint16_t)index) || !CBB_finish(&cbb, &buf, &len) ||
      !method->hash_c(method->group, out, buf, len)) {
    goto err;
  }

  ok = 1;

err:
  CBB_cleanup(&cbb);
  OPENSSL_free(buf);
  return ok;
}